

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu2.c
# Opt level: O0

MPP_RET hal_avsd_vdpu2_gen_regs(void *decoder,HalTaskInfo *task)

{
  MPP_RET MVar1;
  AvsdHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *decoder_local;
  
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","In.","hal_avsd_vdpu2_gen_regs");
  }
  if (((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) ||
     (*(int *)(*(long *)((long)decoder + 0x88) + 0x30) != 0)) {
    *(undefined4 *)((long)decoder + 0x218) = *(undefined4 *)((long)decoder + 0x198);
    MVar1 = set_regs_parameters((AvsdHalCtx_t *)decoder,&task->dec);
    if (MVar1 < MPP_OK) {
      if ((avsd_hal_debug & 4) == 0) {
        return MVar1;
      }
      _mpp_log_l(4,"hal_avsd_vdpu2","Function error(%d).\n",(char *)0x0,0x227);
      return MVar1;
    }
  }
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","Out.","hal_avsd_vdpu2_gen_regs");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_vdpu2_gen_regs(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");
    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->dec_cfg->base.disable_error) {
        goto __RETURN;
    }
    p_hal->data_offset = p_hal->syn.bitstream_offset;

    FUN_CHECK(ret = set_regs_parameters(p_hal, &task->dec));
__RETURN:
    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
__FAILED:
    return ret;

}